

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeArray
          (Interpreter *this,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *v)

{
  unsigned_long uVar1;
  long lVar2;
  ulong uVar3;
  _Rb_tree_node_base *p_Var4;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  anon_union_8_3_4e909c26_for_v extraout_RDX_00;
  anon_union_8_3_4e909c26_for_v aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Value VVar8;
  HeapEntity *local_28;
  
  VVar8._0_8_ = (HeapEntity *)operator_new(0x28);
  (VVar8._0_8_)->type = ARRAY;
  (VVar8._0_8_)->_vptr_HeapEntity = (_func_int **)&PTR__HeapArray_0023c5b8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)(VVar8._0_8_ + 1),v);
  local_28 = VVar8._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,&local_28);
  (VVar8._0_8_)->mark = (this->heap).lastMark;
  lVar2 = (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = lVar2 >> 3;
  (this->heap).numEntities = uVar3;
  aVar5 = extraout_RDX;
  if (((this->heap).gcTuneMinObjects < uVar3) &&
     (auVar6._8_4_ = (int)(lVar2 >> 0x23), auVar6._0_8_ = uVar3, auVar6._12_4_ = 0x45300000,
     uVar1 = (this->heap).lastNumEntities, auVar7._8_4_ = (int)(uVar1 >> 0x20), auVar7._0_8_ = uVar1
     , auVar7._12_4_ = 0x45300000,
     ((auVar7._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
     (this->heap).gcTuneGrowthTrigger <
     (auVar6._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0))) {
    Heap::markFrom(&this->heap,VVar8._0_8_);
    Stack::mark(&this->stack,&this->heap);
    if (((this->scratch).t & ARRAY) != NULL_TYPE) {
      Heap::markFrom(&this->heap,(this->scratch).v.h);
    }
    for (p_Var4 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (*(HeapEntity **)(*(long *)(p_Var4 + 3) + 0x40) != (HeapEntity *)0x0) {
        Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var4 + 3) + 0x40));
      }
    }
    for (p_Var4 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var4 + 2));
    }
    Heap::sweep(&this->heap);
    aVar5 = extraout_RDX_00;
  }
  VVar8.v.h = aVar5.h;
  return VVar8;
}

Assistant:

Value makeArray(const std::vector<HeapThunk *> &v)
    {
        Value r;
        r.t = Value::ARRAY;
        r.v.h = makeHeap<HeapArray>(v);
        return r;
    }